

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::write_hash_request(bt_peer_connection *this,hash_request *req)

{
  bool bVar1;
  uint uVar2;
  element_type *this_00;
  torrent_info *this_01;
  const_iterator __first;
  const_iterator __last;
  counters *this_02;
  span<const_char> local_e0;
  int local_cc;
  undefined1 local_c8 [8];
  sha256_hash root;
  file_storage *fs;
  torrent_info *ti;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  char *ptr;
  char buf [53];
  hash_request *req_local;
  bt_peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&ptr;
  write_uint32<int,char*>
            (0x31,(char **)&t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  write_uint8<libtorrent::aux::bt_peer_connection::message_type,char*>
            (msg_hash_request,
             (char **)&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  peer_connection::associated_torrent((peer_connection *)local_80);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_70);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)local_80);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_70);
    this_01 = torrent::torrent_file(this_00);
    root.m_number._M_elems._24_8_ = torrent_info::files(this_01);
    local_cc = (req->file).m_val;
    file_storage::root((sha256_hash *)local_c8,(file_storage *)root.m_number._M_elems._24_8_,
                       (file_index_t)local_cc);
    __first = digest32<256L>::begin((digest32<256L> *)local_c8);
    __last = digest32<256L>::end((digest32<256L> *)local_c8);
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ::std::copy<unsigned_char_const*,char*>
                   (__first,__last,
                    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
    write_uint32<int,char*>
              (req->base,
               (char **)&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    write_uint32<int,char*>
              (req->index,
               (char **)&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    write_uint32<int,char*>
              (req->count,
               (char **)&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    write_uint32<int,char*>
              (req->proof_layers,
               (char **)&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    this_02 = peer_connection::stats_counters(&this->super_peer_connection);
    counters::inc_stats_counter(this_02,0x68,1);
    ::std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>::
    push_back(&this->m_hash_requests,req);
    bVar1 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
    if (bVar1) {
      uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)req);
      peer_connection::peer_log
                (&this->super_peer_connection,outgoing_message,"HASH_REQUEST",
                 "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)uVar2,(ulong)(uint)req->base,
                 req->index,req->count,req->proof_layers);
    }
    span<char_const>::span<char,53l>((span<char_const> *)&local_e0,(char (*) [53])&ptr);
    peer_connection::send_buffer(&this->super_peer_connection,local_e0);
  }
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_70);
  return;
}

Assistant:

void bt_peer_connection::write_hash_request(hash_request const& req)
	{
		INVARIANT_CHECK;

		char buf[5 + sha256_hash::size() + 4 * 4];
		char* ptr = buf;
		aux::write_uint32(int(sizeof(buf) - 4), ptr);
		aux::write_uint8(msg_hash_request, ptr);

		auto t = associated_torrent().lock();
		if (!t) return;
		auto const& ti = t->torrent_file();
		auto const& fs = ti.files();
		auto const root = fs.root(req.file);

		ptr = std::copy(root.begin(), root.end(), ptr);

		TORRENT_ASSERT(validate_hash_request(req, t->torrent_file().files()));

		aux::write_uint32(req.base, ptr);
		aux::write_uint32(req.index, ptr);
		aux::write_uint32(req.count, ptr);
		aux::write_uint32(req.proof_layers, ptr);

		stats_counters().inc_stats_counter(counters::num_outgoing_hash_request);

		m_hash_requests.push_back(req);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "HASH_REQUEST"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, int(req.file), req.base, req.index, req.count, req.proof_layers);
		}
#endif

		send_buffer(buf);
	}